

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O0

void fftFree(void)

{
  long i1;
  long local_8;
  
  for (local_8 = 0x1f; -1 < local_8; local_8 = local_8 + -1) {
    if (BRLowArray[local_8] != (short *)0x0) {
      free(BRLowArray[local_8]);
      BRLowArray[local_8] = (short *)0x0;
    }
  }
  for (local_8 = 0x3f; -1 < local_8; local_8 = local_8 + -1) {
    if (UtblArray[local_8] != (float *)0x0) {
      free(UtblArray[local_8]);
      UtblArray[local_8] = (float *)0x0;
    }
  }
  return;
}

Assistant:

void fftFree(){
// release storage for all private cosine and bit reversed tables
long i1;
for (i1=8*sizeof(long)/2-1; i1>=0; i1--){
	if (BRLowArray[i1] != 0){
		free(BRLowArray[i1]);
		BRLowArray[i1] = 0;
	};
};
for (i1=8*sizeof(long)-1; i1>=0; i1--){
	if (UtblArray[i1] != 0){
		free(UtblArray[i1]);
		UtblArray[i1] = 0;
	};
};
}